

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O1

off_t cm_zlib_gzseek64(gzFile file,off_t offset,int whence)

{
  uint uVar1;
  int iVar2;
  __off_t _Var3;
  ulong uVar4;
  uchar *puVar5;
  
  puVar5 = (uchar *)0xffffffffffffffff;
  if ((((file != (gzFile)0x0) && ((uVar1 = file[1].have, uVar1 == 0x79b1 || (uVar1 == 0x1c4f)))) &&
      ((iVar2 = *(int *)((long)&file[4].pos + 4), iVar2 == 0 || (iVar2 == -5)))) &&
     ((uint)whence < 2)) {
    if (whence == 0) {
      offset = offset - file->pos;
    }
    else if ((int)file[4].pos != 0) {
      offset = (off_t)(file[4].next + offset);
    }
    *(undefined4 *)&file[4].pos = 0;
    if (((uVar1 == 0x1c4f) && (*(int *)((long)&file[2].pos + 4) == 1)) &&
       (-1 < (long)(offset + file->pos))) {
      _Var3 = lseek(*(int *)&file[1].field_0x4,offset - (ulong)file->have,1);
      if (_Var3 != -1) {
        file->have = 0;
        file[3].next = (uchar *)0x0;
        *(undefined4 *)&file[4].pos = 0;
        if (*(void **)(file + 5) != (void *)0x0) {
          if (*(int *)((long)&file[4].pos + 4) != -4) {
            free(*(void **)(file + 5));
          }
          *(undefined8 *)(file + 5) = 0;
        }
        *(undefined4 *)((long)&file[4].pos + 4) = 0;
        *(undefined4 *)&file[5].pos = 0;
        puVar5 = (uchar *)(offset + file->pos);
        file->pos = (off_t)puVar5;
      }
    }
    else if ((-1 < offset) ||
            (((uVar1 == 0x1c4f && (offset = offset + file->pos, -1 < offset)) &&
             (iVar2 = cm_zlib_gzrewind(file), iVar2 != -1)))) {
      if (file[1].have == 0x1c4f) {
        uVar1 = file->have;
        uVar4 = offset & 0xffffffff;
        if ((long)(ulong)uVar1 <= offset) {
          uVar4 = (ulong)uVar1;
        }
        file->have = uVar1 - (int)uVar4;
        file->next = file->next + uVar4;
        file->pos = file->pos + uVar4;
        offset = offset + -uVar4;
      }
      if ((uchar *)offset != (uchar *)0x0) {
        *(undefined4 *)&file[4].pos = 1;
        file[4].next = (uchar *)offset;
      }
      puVar5 = (uchar *)(offset + file->pos);
    }
  }
  return (off_t)puVar5;
}

Assistant:

z_off64_t ZEXPORT gzseek64(gzFile file, z_off64_t offset, int whence) {
    unsigned n;
    z_off64_t ret;
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return -1;

    /* check that there's no error */
    if (state->err != Z_OK && state->err != Z_BUF_ERROR)
        return -1;

    /* can only seek from start or relative to current position */
    if (whence != SEEK_SET && whence != SEEK_CUR)
        return -1;

    /* normalize offset to a SEEK_CUR specification */
    if (whence == SEEK_SET)
        offset -= state->x.pos;
    else if (state->seek)
        offset += state->skip;
    state->seek = 0;

    /* if within raw area while reading, just go there */
    if (state->mode == GZ_READ && state->how == COPY &&
            state->x.pos + offset >= 0) {
        ret = LSEEK(state->fd, offset - (z_off64_t)state->x.have, SEEK_CUR);
        if (ret == -1)
            return -1;
        state->x.have = 0;
        state->eof = 0;
        state->past = 0;
        state->seek = 0;
        gz_error(state, Z_OK, NULL);
        state->strm.avail_in = 0;
        state->x.pos += offset;
        return state->x.pos;
    }

    /* calculate skip amount, rewinding if needed for back seek when reading */
    if (offset < 0) {
        if (state->mode != GZ_READ)         /* writing -- can't go backwards */
            return -1;
        offset += state->x.pos;
        if (offset < 0)                     /* before start of file! */
            return -1;
        if (gzrewind(file) == -1)           /* rewind, then skip to offset */
            return -1;
    }

    /* if reading, skip what's in output buffer (one less gzgetc() check) */
    if (state->mode == GZ_READ) {
        n = GT_OFF(state->x.have) || (z_off64_t)state->x.have > offset ?
            (unsigned)offset : state->x.have;
        state->x.have -= n;
        state->x.next += n;
        state->x.pos += n;
        offset -= n;
    }

    /* request skip (if not zero) */
    if (offset) {
        state->seek = 1;
        state->skip = offset;
    }
    return state->x.pos + offset;
}